

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argparse.hpp
# Opt level: O3

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
argparse::Argument::get<std::__cxx11::string>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,Argument *this)

{
  any *__any;
  long *plVar1;
  logic_error *this_00;
  long *plVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  long *local_40;
  long local_38;
  long local_30;
  long lStack_28;
  
  __any = (this->m_values).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
          super__Vector_impl_data._M_start;
  if (__any == (this->m_values).super__Vector_base<std::any,_std::allocator<std::any>_>._M_impl.
               super__Vector_impl_data._M_finish) {
    if ((this->m_default_value)._M_manager == (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::operator+(&local_60,"No value provided for \'",
                     (this->m_names).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish + -1);
      plVar1 = (long *)std::__cxx11::string::append((char *)&local_60);
      local_40 = (long *)*plVar1;
      plVar2 = plVar1 + 2;
      if (local_40 == plVar2) {
        local_30 = *plVar2;
        lStack_28 = plVar1[3];
        local_40 = &local_30;
      }
      else {
        local_30 = *plVar2;
      }
      local_38 = plVar1[1];
      *plVar1 = (long)plVar2;
      plVar1[1] = 0;
      *(undefined1 *)(plVar1 + 2) = 0;
      std::logic_error::logic_error(this_00,(string *)&local_40);
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
    plVar1 = (long *)std::__any_caster<std::__cxx11::string>(&this->m_default_value);
  }
  else {
    plVar1 = (long *)std::__any_caster<std::__cxx11::string>(__any);
  }
  if (plVar1 != (long *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,*plVar1,plVar1[1] + *plVar1);
    return __return_storage_ptr__;
  }
  std::__throw_bad_any_cast();
}

Assistant:

T get() const {
    if (!m_values.empty()) {
      if constexpr (details::IsContainer<T>) {
        return any_cast_container<T>(m_values);
      } else {
        return std::any_cast<T>(m_values.front());
      }
    }
    if (m_default_value.has_value()) {
      return std::any_cast<T>(m_default_value);
    }
    if constexpr (details::IsContainer<T>) {
      if (!m_accepts_optional_like_value) {
        return any_cast_container<T>(m_values);
      }
    }

    throw std::logic_error("No value provided for '" + m_names.back() + "'.");
  }